

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

int __thiscall Cleaner::CleanRule(Cleaner *this,char *rule)

{
  State *pSVar1;
  int iVar2;
  size_t sVar3;
  Rule *rule_00;
  string local_48;
  
  if (rule != (char *)0x0) {
    this->status_ = 0;
    this->cleaned_files_count_ = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->removed_)._M_t);
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    clear(&(this->cleaned_)._M_t);
    pSVar1 = this->state_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar3 = strlen(rule);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,rule,rule + sVar3);
    rule_00 = BindingEnv::LookupRule(&pSVar1->bindings_,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (rule_00 == (Rule *)0x0) {
      Error("unknown rule \'%s\'",rule);
      this->status_ = 1;
      iVar2 = 1;
    }
    else {
      CleanRule(this,rule_00);
      iVar2 = this->status_;
    }
    return iVar2;
  }
  __assert_fail("rule",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean.cc",
                0xf9,"int Cleaner::CleanRule(const char *)");
}

Assistant:

int Cleaner::CleanRule(const char* rule) {
  assert(rule);

  Reset();
  const Rule* r = state_->bindings_.LookupRule(rule);
  if (r) {
    CleanRule(r);
  } else {
    Error("unknown rule '%s'", rule);
    status_ = 1;
  }
  return status_;
}